

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire.cpp
# Opt level: O1

double __thiscall anon_unknown.dwarf_50741::ExprEval::ParseAtom(ExprEval *this,char **expr)

{
  char cVar1;
  char *in_RAX;
  char *pcVar2;
  double dVar3;
  char *end_ptr;
  char *local_28;
  
  pcVar2 = *expr;
  cVar1 = *pcVar2;
  while (cVar1 == ' ') {
    pcVar2 = pcVar2 + 1;
    *expr = pcVar2;
    cVar1 = *pcVar2;
  }
  if (cVar1 == '-') {
    *expr = pcVar2 + 1;
  }
  if (**expr == '+') {
    *expr = *expr + 1;
  }
  pcVar2 = *expr;
  if (*pcVar2 == '(') {
    *expr = pcVar2 + 1;
    this->_paren_count = this->_paren_count + 1;
    dVar3 = ParseSummands(this,expr);
    pcVar2 = *expr;
    if (*pcVar2 != ')') {
      this->_err = 1;
      this->_err_pos = pcVar2;
      return 0.0;
    }
    *expr = pcVar2 + 1;
    this->_paren_count = this->_paren_count + -1;
  }
  else {
    local_28 = in_RAX;
    dVar3 = strtod(pcVar2,&local_28);
    pcVar2 = *expr;
    if (local_28 == pcVar2) {
      this->_err = 2;
      this->_err_pos = pcVar2;
      return 0.0;
    }
    *expr = local_28;
  }
  if (cVar1 == '-') {
    dVar3 = -dVar3;
  }
  return dVar3;
}

Assistant:

double ParseAtom(const char*& expr) {
            // Skip spaces
            while(*expr == ' ')
                expr++;

            // Handle the sign before parenthesis (or before number)
            bool negative = false;
            if(*expr == '-') {
                negative = true;
                expr++;
            }
            if(*expr == '+') {
                expr++;
            }

            // Check if there is parenthesis
            if(*expr == '(') {
                expr++;
                _paren_count++;
                double res = ParseSummands(expr);
                if(*expr != ')') {
                    // Unmatched opening parenthesis
                    _err = EEE_PARENTHESIS;
                    _err_pos = expr;
                    return 0;
                }
                expr++;
                _paren_count--;
                return negative ? -res : res;
            }

            // It should be a number; convert it to double
            char* end_ptr;
            double res = strtod(expr, &end_ptr);
            if(end_ptr == expr) {
                // Report error
                _err = EEE_WRONG_CHAR;
                _err_pos = expr;
                return 0;
            }
            // Advance the pointer and return the result
            expr = end_ptr;
            return negative ? -res : res;
        }